

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfsUtil.h
# Opt level: O1

void __thiscall FileTree::insertNode(FileTree *this,string *value,bool isFile)

{
  pointer pcVar1;
  TreeNode *pTVar2;
  bool bVar3;
  TreeNode *pTVar4;
  TreeNode **ppTVar5;
  TreeNode *pTVar6;
  TreeNode *nodeParent;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  TreeNode *local_90;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  local_90 = this->root;
  pcVar1 = (value->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + value->_M_string_length);
  bVar3 = findNode(this,&local_50,isFile,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (!bVar3) {
    split(&local_68,value,'/');
    pTVar4 = (TreeNode *)operator_new(0x40);
    pcVar1 = local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p;
    local_88 = local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar1,
               pcVar1 + local_68.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length);
    (pTVar4->value)._M_dataplus._M_p = (pointer)&(pTVar4->value).field_2;
    std::__cxx11::string::_M_construct<char*>((string *)pTVar4,local_88,local_88 + local_80);
    pTVar4->isFile = isFile;
    pTVar4->parent = (TreeNode *)0x0;
    pTVar4->firstChild = (TreeNode *)0x0;
    pTVar4->nextSibling = (TreeNode *)0x0;
    if (local_88 != local_78) {
      operator_delete(local_88);
    }
    pTVar4->parent = local_90;
    pTVar2 = local_90->firstChild;
    if (local_90->firstChild == (TreeNode *)0x0) {
      ppTVar5 = &local_90->firstChild;
    }
    else {
      do {
        pTVar6 = pTVar2;
        pTVar2 = pTVar6->nextSibling;
      } while (pTVar2 != (TreeNode *)0x0);
      ppTVar5 = &pTVar6->nextSibling;
    }
    *ppTVar5 = pTVar4;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
  }
  return;
}

Assistant:

void insertNode(const std::string value, bool isFile)
    {
        TreeNode *nodeParent = root;

        //bool isFound = findNode(value, isFile, nodeParent);
        bool isFound = findNode(value, isFile, nodeParent);


        if (!isFound)
        {
            std::vector<std::string> files = split(value, '/');
            TreeNode* newNode = new TreeNode(files.back(), isFile);

            newNode->parent = nodeParent;

            TreeNode *temp = nodeParent->firstChild;

            if (temp == nullptr)
            {
                nodeParent->firstChild = newNode;
            }

            else
            {
                while (temp->nextSibling != nullptr)
                {
                    temp = temp->nextSibling;
                }

                temp->nextSibling = newNode;


            }
        }
    }